

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeT2AddrModeImm8(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  void *Decoder_00;
  uint64_t extraout_RDX;
  uint64_t Address_00;
  uint uVar3;
  uint uVar4;
  
  uVar4 = Val >> 9 & 0xf;
  uVar1 = MCInst_getOpcode(Inst);
  if (((0x1a < uVar1 - 0xa27) || ((0x4284021U >> (uVar1 - 0xa27 & 0x1f) & 1) == 0)) ||
     (uVar4 != 0xf)) {
    uVar3 = Val & 0x1ff;
    uVar1 = MCInst_getOpcode(Inst);
    Decoder_00 = (void *)(ulong)(uVar1 - 0x942);
    Address_00 = extraout_RDX;
    if (((uVar1 - 0x942 < 0x28) &&
        (Address_00 = 0x8080808001, (0x8080808001U >> ((ulong)Decoder_00 & 0x3f) & 1) != 0)) ||
       ((uVar1 - 0xa27 < 0x16 &&
        (Decoder_00 = &x86DisassemblerTwoByteOpcodes[0x45].modRMDecisions[0x4c].field_0x1,
        (0x204001U >> (uVar1 - 0xa27 & 0x1f) & 1) != 0)))) {
      uVar3 = uVar3 | 0x100;
    }
    DVar2 = DecodeGPRRegisterClass(Inst,uVar4,Address_00,Decoder_00);
    if ((DVar2 | 2) == MCDisassembler_Success) {
      uVar1 = -(uVar3 & 0xff);
      if (uVar3 >> 8 != 0) {
        uVar1 = uVar3 & 0xff;
      }
      uVar4 = 0x80000000;
      if (uVar3 != 0) {
        uVar4 = uVar1;
      }
      MCOperand_CreateImm0(Inst,(long)(int)uVar4);
      return DVar2;
    }
  }
  return MCDisassembler_Fail;
}

Assistant:

static DecodeStatus DecodeT2AddrModeImm8(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Val, 9, 4);
	unsigned imm = fieldFromInstruction_4(Val, 0, 9);

	// Thumb stores cannot use PC as dest register.
	switch (MCInst_getOpcode(Inst)) {
		case ARM_t2STRT:
		case ARM_t2STRBT:
		case ARM_t2STRHT:
		case ARM_t2STRi8:
		case ARM_t2STRHi8:
		case ARM_t2STRBi8:
			if (Rn == 15)
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	// Some instructions always use an additive offset.
	switch (MCInst_getOpcode(Inst)) {
		case ARM_t2LDRT:
		case ARM_t2LDRBT:
		case ARM_t2LDRHT:
		case ARM_t2LDRSBT:
		case ARM_t2LDRSHT:
		case ARM_t2STRT:
		case ARM_t2STRBT:
		case ARM_t2STRHT:
			imm |= 0x100;
			break;
		default:
			break;
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeT2Imm8(Inst, imm, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}